

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ALSADriver.cpp
# Opt level: O2

bool __thiscall
ALSAMidiDriver::processSeqEvent
          (ALSAMidiDriver *this,snd_seq_event_t *seq_event,MidiSession *midiSession)

{
  snd_seq_event_type_t sVar1;
  uchar uVar2;
  uchar *abuf;
  Bit8u *sysexData;
  qsizetype qVar3;
  SynthRoute *this_00;
  MasterClockNanos MVar4;
  MidiSession *midiSession_00;
  uint uVar5;
  Bit32u msg;
  ALSAMidiDriver *this_01;
  uint msg_00;
  uint clientAddr;
  QDebug QStack_68;
  uint local_5c;
  QVarLengthArray<unsigned_char,_1000LL> *local_58;
  undefined4 local_50;
  undefined8 local_4c;
  undefined8 uStack_44;
  undefined4 local_3c;
  char *local_38;
  
  this_01 = (ALSAMidiDriver *)midiSession;
  this_00 = MidiSession::getSynthRoute(midiSession);
  sVar1 = seq_event->type;
  switch(sVar1) {
  case '\x06':
    msg = *(uint3 *)&seq_event->data | 0x90;
    break;
  case '\a':
    msg = *(uint3 *)&seq_event->data | 0x80;
    break;
  case '\b':
  case '\t':
  case '\f':
  case '\x0f':
    goto switchD_00158186_caseD_8;
  case '\n':
    uVar5 = (seq_event->data).raw32.d[2] << 0x10 |
            (seq_event->data).note.duration << 8 | (uint)(seq_event->data).note.channel;
    goto LAB_001582c8;
  case '\v':
    msg = (seq_event->data).raw32.d[2] << 8 | (uint)(seq_event->data).note.channel | 0xc0;
    break;
  case '\r':
    uVar5 = (seq_event->data).raw32.d[2];
    msg = ((uVar5 & 0x3f80) << 9 | (uVar5 & 0x7f) << 8 | (uint)(seq_event->data).note.channel | 0xe0
          ) ^ 0x400000;
    break;
  case '\x0e':
    uVar5 = (seq_event->data).note.duration;
    if ((uVar5 & 0xe0) == 0x20) {
      return false;
    }
    uVar5 = ((seq_event->data).raw32.d[2] & 0xffffff80) << 9 |
            uVar5 << 8 | (uint)(seq_event->data).note.channel;
LAB_001582c8:
    msg = uVar5 | 0xb0;
    break;
  case '\x10':
    if ((seq_event->data).note.duration != 0) {
      return false;
    }
    uVar5 = (uint)(seq_event->data).note.channel;
    msg_00 = uVar5 | 0x64b0;
    MVar4 = MasterClock::getClockNanos();
    SynthRoute::pushMIDIShortMessage(this_00,midiSession,msg_00,MVar4);
    MVar4 = MasterClock::getClockNanos();
    SynthRoute::pushMIDIShortMessage(this_00,midiSession,uVar5 | 0x65b0,MVar4);
    msg = ((seq_event->data).raw32.d[2] << 9 | msg_00) & 0x7f00ff | 0x600;
    break;
  default:
    switch(sVar1) {
    case '<':
      local_50 = 2;
      local_3c = 0;
      local_4c = 0;
      uStack_44 = 0;
      local_38 = "default";
      QMessageLogger::debug();
      QDebug::operator<<(&QStack_68,"ALSAMidiDriver: Client start");
      goto LAB_00158435;
    case '=':
      local_50 = 2;
      local_3c = 0;
      local_4c = 0;
      uStack_44 = 0;
      local_38 = "default";
      QMessageLogger::debug();
      QDebug::operator<<(&QStack_68,"ALSAMidiDriver: Client exit");
      QDebug::~QDebug(&QStack_68);
      return true;
    case '>':
      local_50 = 2;
      local_3c = 0;
      local_4c = 0;
      uStack_44 = 0;
      local_38 = "default";
      QMessageLogger::debug();
      QDebug::operator<<(&QStack_68,"ALSAMidiDriver: Client change");
LAB_00158435:
      QDebug::~QDebug(&QStack_68);
      break;
    case '?':
    case '@':
    case 'A':
    case 'B':
      break;
    case 'C':
      local_5c = getSourceAddr(this_01,seq_event);
      midiSession_00 = findMidiSessionForClient(this,local_5c);
      if (midiSession_00 != (MidiSession *)0x0) {
        MidiDriver::deleteMidiSession(&this->super_MidiDriver,midiSession_00);
      }
      QtPrivate::sequential_erase_with_copy<QList<unsigned_int>,unsigned_int>
                (&this->clients,&local_5c);
      break;
    default:
      if (sVar1 != 0x82) {
        return false;
      }
      uVar5 = (seq_event->data).raw32.d[0];
      if ((ulong)uVar5 != 0) {
        abuf = (uchar *)(seq_event->data).ext.ptr;
        uVar2 = abuf[uVar5 - 1];
        if ((*abuf == 0xf0) && (uVar2 == 0xf7)) {
          MVar4 = MasterClock::getClockNanos();
          SynthRoute::pushMIDISysex(this_00,midiSession,abuf,uVar5,MVar4);
        }
        else {
          local_58 = &this->sysexBuffer;
          QVarLengthArray<unsigned_char,_1000LL>::append(local_58,abuf,(ulong)uVar5);
          if (uVar2 == 0xf7) {
            sysexData = (this->sysexBuffer).ptr;
            qVar3 = (this->sysexBuffer).s;
            MVar4 = MasterClock::getClockNanos();
            SynthRoute::pushMIDISysex(this_00,midiSession,sysexData,(uint)qVar3,MVar4);
            QVarLengthArray<unsigned_char,_1000LL>::clear(local_58);
          }
        }
      }
    }
    goto switchD_00158186_caseD_8;
  }
  MVar4 = MasterClock::getClockNanos();
  SynthRoute::pushMIDIShortMessage(this_00,midiSession,msg,MVar4);
switchD_00158186_caseD_8:
  return false;
}

Assistant:

bool ALSAMidiDriver::processSeqEvent(snd_seq_event_t *seq_event, MidiSession *midiSession) {
	SynthRoute *synthRoute = midiSession->getSynthRoute();
	MT32Emu::Bit32u msg = 0;
	switch(seq_event->type) {
	case SND_SEQ_EVENT_NOTEON:
		msg = 0x90;
		msg |= seq_event->data.note.channel;
		msg |= seq_event->data.note.note << 8;
		msg |= seq_event->data.note.velocity << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_NOTEOFF:
		msg = 0x80;
		msg |= seq_event->data.note.channel;
		msg |= seq_event->data.note.note << 8;
		msg |= seq_event->data.note.velocity << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_CONTROLLER:
		msg = 0xB0;
		msg |= seq_event->data.control.channel;
		msg |= seq_event->data.control.param << 8;
		msg |= seq_event->data.control.value << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_CONTROL14:
		// The real hardware units don't support any of LSB controllers,
		// so we just send the MSB silently ignoring the LSB
		if ((seq_event->data.control.param & 0xE0) == 0x20) break;
		msg = 0xB0;
		msg |= seq_event->data.control.channel;
		msg |= seq_event->data.control.param << 8;
		msg |= (seq_event->data.control.value >> 7) << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_NONREGPARAM:
		// The real hardware units don't support NRPNs
		break;

	case SND_SEQ_EVENT_REGPARAM:
		// The real hardware units support only RPN 0 (pitch bender range) and only MSB matters
		if (seq_event->data.control.param != 0) break;
		msg = 0x64B0;
		msg |= seq_event->data.control.channel;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());

		msg &= 0xFF;
		msg |= 0x6500;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());

		msg &= 0xFF;
		msg |= 0x0600;
		msg |= ((seq_event->data.control.value >> 7) & 0x7F) << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_PGMCHANGE:
		msg = 0xC0;
		msg |= seq_event->data.control.channel;
		msg |= seq_event->data.control.value << 8;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_PITCHBEND:
		msg = 0xE0;
		msg |= seq_event->data.control.channel;
		int bend;
		bend = seq_event->data.control.value + 8192;
		msg |= (bend & 0x7F) << 8;
		msg |= ((bend >> 7) & 0x7F) << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_SYSEX: {
		MT32Emu::Bit8u *sysexData = (MT32Emu::Bit8u *)seq_event->data.ext.ptr;
		uint sysexLength = seq_event->data.ext.len;

		if(sysexLength == 0) break; // no-op

		// We may well get a SysEx fragment, so if this is the case, it's buffered and the full SysEx is reconstructed further on.
		// If not, don't bother and take a shortcut.
		bool hasSysexStart = sysexData[0] == MIDI_CMD_COMMON_SYSEX;
		bool hasSysexEnd = sysexData[sysexLength - 1] == MIDI_CMD_COMMON_SYSEX_END;
		if (hasSysexStart && hasSysexEnd) {
			synthRoute->pushMIDISysex(*midiSession, sysexData, sysexLength, MasterClock::getClockNanos());
			break;
		}
		// OK, accumulate SysEx data received so far and commit when ready.
		sysexBuffer.append(sysexData, sysexLength);
		if (hasSysexEnd) {
			synthRoute->pushMIDISysex(*midiSession, sysexBuffer.constData(), sysexBuffer.size(), MasterClock::getClockNanos());
			sysexBuffer.clear();
		}
		break;
	}

	case SND_SEQ_EVENT_PORT_SUBSCRIBED:
		// no-op
		break;
	case SND_SEQ_EVENT_PORT_UNSUBSCRIBED:
		unsigned int clientAddr;
		clientAddr = getSourceAddr(seq_event);
		MidiSession *midiSession;
		midiSession = findMidiSessionForClient(clientAddr);
		if (midiSession != NULL) deleteMidiSession(midiSession);
		clients.removeAll(clientAddr);
		break;

	case SND_SEQ_EVENT_CLIENT_START:
		qDebug() << "ALSAMidiDriver: Client start";
		break;
	case SND_SEQ_EVENT_CLIENT_CHANGE:
		qDebug() << "ALSAMidiDriver: Client change";
		break;
	case SND_SEQ_EVENT_CLIENT_EXIT:
		qDebug() << "ALSAMidiDriver: Client exit";
		return true;

	case SND_SEQ_EVENT_NOTE:
		// FIXME: Implement these
		break;

	default:
		break;
	}
	return false;
}